

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

StatusOr<double> __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseFp<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  bool bVar1;
  char cVar2;
  undefined8 uVar3;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa;
  string_view sVar4;
  StatusOr<double> SVar5;
  Status _status_1;
  double n;
  Status _status;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
  local_98;
  double local_90;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
  local_88;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_80;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_50;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
  local_30;
  int local_28;
  
  JsonLexer::PeekKind((JsonLexer *)&local_30.status_);
  local_88 = local_30;
  if (((ulong)local_30 & 1) == 0) {
    LOCK();
    *(int *)local_30 = *(int *)local_30 + 1;
    UNLOCK();
  }
  if (local_30 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
       )0x1) {
    absl::lts_20240722::internal_statusor::StatusOrData<double>::
    StatusOrData<const_absl::lts_20240722::Status,_0>
              ((StatusOrData<double> *)this,&local_88.status_);
    absl::lts_20240722::Status::~Status(&local_88.status_);
    goto LAB_002c9537;
  }
  if (local_28 == 2) {
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)&local_88.status_,lex);
    local_98 = local_88;
    if (((ulong)local_88 & 1) == 0) {
      LOCK();
      *(int *)local_88 = *(int *)local_88 + 1;
      UNLOCK();
    }
    if (local_88 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::StatusOrData<double>::
      StatusOrData<const_absl::lts_20240722::Status,_0>
                ((StatusOrData<double> *)this,&local_98.status_);
      absl::lts_20240722::Status::~Status(&local_98.status_);
LAB_002c95be:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_88.status_);
      goto LAB_002c9537;
    }
    bVar1 = json_internal::operator==((MaybeOwnedString *)&local_80._M_first,(char (*) [4])"NaN");
    if (bVar1) {
      local_90 = NAN;
    }
    else {
      if (local_88 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
           )0x1) {
LAB_002c95f3:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
        goto LAB_002c95fd;
      }
      bVar1 = json_internal::operator==
                        ((MaybeOwnedString *)&local_80._M_first,(char (*) [9])0x3eb226);
      if (bVar1) {
        local_90 = INFINITY;
      }
      else {
        if (local_88 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
             )0x1) goto LAB_002c95f3;
        bVar1 = json_internal::operator==
                          ((MaybeOwnedString *)&local_80._M_first,(char (*) [10])"-Infinity");
        if (bVar1) {
          local_90 = -INFINITY;
        }
        else {
          if (local_88 !=
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
               )0x1) goto LAB_002c95f3;
          sVar4 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_80._M_first);
          cVar2 = absl::lts_20240722::SimpleAtod(sVar4._M_len,sVar4._M_str,&local_90);
          if (cVar2 == '\0') {
            if (local_88 !=
                (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
                 )0x1) {
              uVar3 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
              absl::lts_20240722::Status::~Status(&local_98.status_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_88.status_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
                        ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)
                         &local_30.status_);
              _Unwind_Resume(uVar3);
            }
            JsonLocation::Invalid
                      ((JsonLocation *)&local_98,&local_50,0x26,
                       "non-number characters in quoted number");
            absl::lts_20240722::internal_statusor::StatusOrData<double>::
            StatusOrData<absl::lts_20240722::Status,_0>
                      ((StatusOrData<double> *)this,&local_98.status_);
            if (((ulong)local_98 & 1) == 0) {
              absl::lts_20240722::status_internal::StatusRep::Unref();
            }
            goto LAB_002c95be;
          }
        }
      }
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_88.status_);
  }
  else {
    if (local_28 != 3) {
      JsonLocation::Invalid
                ((JsonLocation *)&local_88,&lex->json_loc_,0x19,"expected number or string");
      absl::lts_20240722::internal_statusor::StatusOrData<double>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&local_88.status_);
      if (((ulong)local_88 & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
      }
      goto LAB_002c9537;
    }
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&local_88.status_
               ,lex);
    local_98 = local_88;
    if (((ulong)local_88 & 1) == 0) {
      LOCK();
      *(int *)local_88 = *(int *)local_88 + 1;
      UNLOCK();
    }
    if (local_88 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>_1
         )0x1) {
LAB_002c95fd:
      absl::lts_20240722::internal_statusor::StatusOrData<double>::
      StatusOrData<const_absl::lts_20240722::Status,_0>
                ((StatusOrData<double> *)this,&local_98.status_);
      absl::lts_20240722::Status::~Status(&local_98.status_);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)
                 &local_88.status_);
      goto LAB_002c9537;
    }
    local_90 = (double)local_80._0_8_;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)
               &local_88.status_);
  }
  if ((((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) < 9) &&
       ((0x14aU >> (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) & 0x1f)
        & 1) != 0)) && ((ulong)ABS(local_90) < 0x7ff0000000000000)) &&
     (0x7f7fffff < (uint)ABS((float)local_90))) {
    JsonLocation::Invalid((JsonLocation *)&local_88,&lex->json_loc_,0x12,"float out of range");
    absl::lts_20240722::internal_statusor::StatusOrData<double>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&local_88.status_);
    if (((ulong)local_88 & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
  }
  else {
    *(double *)(this + 8) = local_90;
    *(undefined8 *)this = 1;
  }
LAB_002c9537:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_30.status_);
  SVar5.super_StatusOrData<double>.field_1.data_ = extraout_XMM0_Qa.data_;
  SVar5.super_StatusOrData<double>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<double>_1)this;
  return (StatusOr<double>)SVar5.super_StatusOrData<double>;
}

Assistant:

absl::StatusOr<double> ParseFp(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<JsonLexer::Kind> kind = lex.PeekKind();
  RETURN_IF_ERROR(kind.status());

  double n;
  switch (*kind) {
    case JsonLexer::kNum: {
      absl::StatusOr<LocationWith<double>> d = lex.ParseNumber();
      RETURN_IF_ERROR(d.status());
      n = d->value;
      break;
    }
    case JsonLexer::kStr: {
      absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
      RETURN_IF_ERROR(str.status());

      if (str->value == "NaN") {
        n = NAN;
      } else if (str->value == "Infinity") {
        n = INFINITY;
      } else if (str->value == "-Infinity") {
        n = -INFINITY;
      } else if (!absl::SimpleAtod(str->value.AsView(), &n)) {
        return str->loc.Invalid("non-number characters in quoted number");
      }
      break;
    }
    default:
      return lex.Invalid("expected number or string");
  }

  if (Traits::Is32Bit(field)) {
    // Detect out-of-range 32-bit floats by seeing whether the conversion result
    // is still finite. Finite extreme values may have textual representations
    // that parse to 64-bit values outside the 32-bit range, but which are
    // closer to the 32-bit extreme than to the "next value with the same
    // precision".
    if (std::isfinite(n) && !std::isfinite(static_cast<float>(n))) {
      return lex.Invalid("float out of range");
    }
  }

  return n;
}